

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_mips.c
# Opt level: O1

int main(void)

{
  int iVar1;
  uint8_t *buffer;
  cs_detail *pcVar2;
  cs_err cVar3;
  size_t count;
  char *pcVar4;
  size_t len;
  size_t len_00;
  char *__format;
  long *plVar5;
  ulong uVar6;
  long lVar7;
  size_t sVar8;
  cs_insn *insn;
  cs_insn *local_48;
  uchar *local_40;
  long local_38;
  
  lVar7 = 0;
  do {
    cVar3 = cs_open((&DAT_002642f0)[lVar7 * 8],(&DAT_002642f4)[lVar7 * 8],&handle);
    if (cVar3 == CS_ERR_OK) {
      local_38 = lVar7;
      cs_option(handle,CS_OPT_DETAIL,3);
      buffer = (&PTR_anon_var_dwarf_27_002642f8)[lVar7 * 4];
      local_40 = (uchar *)(&DAT_00264300)[lVar7 * 4];
      count = cs_disasm(handle,buffer,(size_t)local_40,0x1000,0,&local_48);
      if (count == 0) {
        puts("****************");
        printf("Platform: %s\n",(&PTR_anon_var_dwarf_45_00264308)[lVar7 * 4]);
        print_string_hex((char *)buffer,local_40,len_00);
        puts("ERROR: Failed to disasm given code!");
      }
      else {
        puts("****************");
        printf("Platform: %s\n",(&PTR_anon_var_dwarf_45_00264308)[lVar7 * 4]);
        print_string_hex((char *)buffer,local_40,len);
        puts("Disasm:");
        sVar8 = 0;
        do {
          printf("0x%lx:\t%s\t%s\n",local_48[sVar8].address,local_48[sVar8].mnemonic,
                 local_48[sVar8].op_str);
          pcVar2 = local_48[sVar8].detail;
          if (pcVar2 != (cs_detail *)0x0) {
            if ((pcVar2->field_6).x86.prefix[0] != '\0') {
              printf("\top_count: %u\n");
            }
            if ((pcVar2->field_6).x86.prefix[0] != '\0') {
              plVar5 = (long *)((long)&pcVar2->field_6 + 0x18);
              uVar6 = 0;
              do {
                iVar1 = (int)plVar5[-2];
                if (iVar1 == 3) {
                  printf("\t\toperands[%u].type: MEM\n",uVar6 & 0xffffffff);
                  if (*(uint *)(plVar5 + -1) != 0) {
                    pcVar4 = cs_reg_name(handle,*(uint *)(plVar5 + -1));
                    printf("\t\t\toperands[%u].mem.base: REG = %s\n",uVar6 & 0xffffffff,pcVar4);
                  }
                  pcVar4 = (char *)*plVar5;
                  if (pcVar4 != (char *)0x0) {
                    __format = "\t\t\toperands[%u].mem.disp: 0x%lx\n";
                    goto LAB_00143412;
                  }
                }
                else {
                  if (iVar1 == 2) {
                    pcVar4 = (char *)plVar5[-1];
                    __format = "\t\toperands[%u].type: IMM = 0x%lx\n";
                  }
                  else {
                    if (iVar1 != 1) goto LAB_00143419;
                    pcVar4 = cs_reg_name(handle,*(uint *)(plVar5 + -1));
                    __format = "\t\toperands[%u].type: REG = %s\n";
                  }
LAB_00143412:
                  printf(__format,uVar6 & 0xffffffff,pcVar4);
                }
LAB_00143419:
                uVar6 = uVar6 + 1;
                plVar5 = plVar5 + 3;
              } while (uVar6 < (pcVar2->field_6).x86.prefix[0]);
            }
            putchar(10);
          }
          sVar8 = sVar8 + 1;
        } while (sVar8 != count);
        printf("0x%lx:\n",(ulong)local_48[count - 1].size + local_48[count - 1].address);
        cs_free(local_48,count);
      }
      putchar(10);
      cs_close(&handle);
      lVar7 = local_38;
    }
    else {
      printf("Failed on cs_open() with error returned: %u\n",(ulong)cVar3);
    }
    lVar7 = lVar7 + 1;
    if (lVar7 == 4) {
      return 0;
    }
  } while( true );
}

Assistant:

int main()
{
	test();

	return 0;
}